

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Orphan<capnp::compiler::ParsedFile> * __thiscall
capnp::compiler::ModuleLoader::ModuleImpl::loadContent
          (Orphan<capnp::compiler::ParsedFile> *__return_storage_ptr__,ModuleImpl *this,
          Orphanage orphanage)

{
  ReadableFile *pRVar1;
  Builder result;
  Reader statements_00;
  Builder result_00;
  ArrayPtr<const_char> input;
  Array<const_char> content;
  Builder statements;
  Orphanage orphanage_local;
  Builder local_190;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  MallocMessageBuilder lexedBuilder;
  ListBuilder local_48;
  
  orphanage_local.capTable = orphanage.capTable;
  orphanage_local.arena = orphanage.arena;
  pRVar1 = (this->file).ptr;
  (*(pRVar1->super_FsNode)._vptr_FsNode[2])(&lexedBuilder,pRVar1);
  (*(pRVar1->super_FsNode)._vptr_FsNode[7])
            (&statements,pRVar1,0,lexedBuilder.super_MessageBuilder.arenaSpace[0]);
  if (statements._builder.data == (void *)0x0) {
    content.ptr = (char *)0x0;
    content.size_ = 0;
    content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    content.ptr = (char *)statements._builder.segment;
    content.size_ = (size_t)statements._builder.capTable;
    content.disposer = (ArrayDisposer *)statements._builder.data;
    statements._builder.segment = (SegmentBuilder *)0x0;
    statements._builder.capTable = (CapTableBuilder *)0x0;
  }
  kj::Array<const_unsigned_char>::~Array((Array<const_unsigned_char> *)&statements);
  lexedBuilder.super_MessageBuilder._vptr_MessageBuilder = (_func_int **)0x0;
  lexedBuilder.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
  kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>::operator=
            (&(this->lineBreaks).ptr,
             (Own<capnp::compiler::LineBreakTable,_std::nullptr_t> *)&lexedBuilder);
  if (lexedBuilder.super_MessageBuilder.arenaSpace[0] != (void *)0x0) {
    lexedBuilder.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    (**(code **)*lexedBuilder.super_MessageBuilder._vptr_MessageBuilder)();
  }
  kj::ctor<capnp::compiler::LineBreakTable,kj::Array<char_const>&>
            ((LineBreakTable *)&this->lineBreaksSpace,&content);
  lexedBuilder.super_MessageBuilder._vptr_MessageBuilder =
       (_func_int **)&kj::DestructorOnlyDisposer<capnp::compiler::LineBreakTable>::instance;
  lexedBuilder.super_MessageBuilder.arenaSpace[0] = &this->lineBreaksSpace;
  kj::Own<capnp::compiler::LineBreakTable,_std::nullptr_t>::operator=
            (&(this->lineBreaks).ptr,
             (Own<capnp::compiler::LineBreakTable,_std::nullptr_t> *)&lexedBuilder);
  if (lexedBuilder.super_MessageBuilder.arenaSpace[0] != (void *)0x0) {
    lexedBuilder.super_MessageBuilder.arenaSpace[0] = (void *)0x0;
    (**(code **)*lexedBuilder.super_MessageBuilder._vptr_MessageBuilder)();
  }
  MallocMessageBuilder::MallocMessageBuilder(&lexedBuilder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedStatements>
            (&statements,&lexedBuilder.super_MessageBuilder);
  input.size_ = content.size_;
  input.ptr = content.ptr;
  result._builder.capTable = statements._builder.capTable;
  result._builder.segment = statements._builder.segment;
  result._builder.data = statements._builder.data;
  result._builder.pointers = statements._builder.pointers;
  result._builder.dataSize = statements._builder.dataSize;
  result._builder.pointerCount = statements._builder.pointerCount;
  result._builder._38_2_ = statements._builder._38_2_;
  lex(input,result,(ErrorReporter *)this);
  Orphanage::newOrphan<capnp::compiler::ParsedFile>(__return_storage_ptr__,&orphanage_local);
  LexedStatements::Builder::getStatements((Builder *)&local_48,&statements);
  capnp::_::ListBuilder::asReader(&local_48);
  capnp::_::OrphanGetImpl<capnp::compiler::ParsedFile,_(capnp::Kind)3>::apply
            (&local_190,&__return_storage_ptr__->builder);
  statements_00.reader.capTable = (CapTableReader *)uStack_160;
  statements_00.reader.segment = (SegmentReader *)local_168;
  statements_00.reader.ptr = (byte *)local_158;
  statements_00.reader.elementCount = (undefined4)uStack_150;
  statements_00.reader.step = uStack_150._4_4_;
  statements_00.reader.structDataSize = (undefined4)local_148;
  statements_00.reader.structPointerCount = local_148._4_2_;
  statements_00.reader.elementSize = local_148._6_1_;
  statements_00.reader._39_1_ = local_148._7_1_;
  statements_00.reader._40_8_ = uStack_140;
  result_00._builder.capTable = local_190._builder.capTable;
  result_00._builder.segment = local_190._builder.segment;
  result_00._builder.data = local_190._builder.data;
  result_00._builder.pointers = local_190._builder.pointers;
  result_00._builder.dataSize = local_190._builder.dataSize;
  result_00._builder.pointerCount = local_190._builder.pointerCount;
  result_00._builder._38_2_ = local_190._builder._38_2_;
  parseFile(statements_00,result_00,(ErrorReporter *)this,this->loader->fileIdsRequired);
  MallocMessageBuilder::~MallocMessageBuilder(&lexedBuilder);
  kj::Array<const_char>::~Array(&content);
  return __return_storage_ptr__;
}

Assistant:

Orphan<ParsedFile> loadContent(Orphanage orphanage) override {
    kj::Array<const char> content = file->mmap(0, file->stat().size).releaseAsChars();

    lineBreaks = kj::none;  // In case loadContent() is called multiple times.
    lineBreaks = lineBreaksSpace.construct(content);

    MallocMessageBuilder lexedBuilder;
    auto statements = lexedBuilder.initRoot<LexedStatements>();
    lex(content, statements, *this);

    auto parsed = orphanage.newOrphan<ParsedFile>();
    parseFile(statements.getStatements(), parsed.get(), *this, loader.areFileIdsRequired());
    return parsed;
  }